

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_intrinsic_sse4.h
# Opt level: O1

uint aom_obmc_variance4x4_avx2(uint8_t *pre,int pre_stride,int32_t *wsrc,int32_t *mask,uint *sse)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  undefined1 auVar3 [64];
  undefined1 auVar4 [16];
  undefined1 auVar5 [64];
  undefined1 auVar6 [16];
  
  auVar3 = ZEXT1664((undefined1  [16])0x0);
  uVar2 = 0xfffffffffffffffc;
  auVar4._8_4_ = 0x800;
  auVar4._0_8_ = 0x80000000800;
  auVar4._12_4_ = 0x800;
  auVar5 = ZEXT1664((undefined1  [16])0x0);
  do {
    auVar1 = vpmovzxbd_avx(ZEXT416(*(uint *)pre));
    auVar1 = vpmaddwd_avx(auVar1,*(undefined1 (*) [16])(mask + uVar2 + 4));
    auVar1 = vpsubd_avx(*(undefined1 (*) [16])(wsrc + uVar2 + 4),auVar1);
    auVar6 = vpsrad_avx(auVar1,0x1f);
    auVar1 = vpaddd_avx(auVar1,auVar4);
    auVar1 = vpaddd_avx(auVar1,auVar6);
    auVar6 = vpsrad_avx(auVar1,0xc);
    auVar1 = vpmulld_avx(auVar6,auVar6);
    auVar1 = vpaddd_avx(auVar1,auVar3._0_16_);
    auVar3 = ZEXT1664(auVar1);
    auVar6 = vpaddd_avx(auVar6,auVar5._0_16_);
    auVar5 = ZEXT1664(auVar6);
    uVar2 = uVar2 + 4;
    pre = (uint8_t *)((long)pre + (long)(pre_stride + -4) + 4);
  } while (uVar2 < 0xc);
  auVar4 = vphaddd_avx(auVar6,auVar6);
  auVar4 = vphaddd_avx(auVar4,auVar4);
  auVar1 = vphaddd_avx(auVar1,auVar1);
  auVar1 = vphaddd_avx(auVar1,auVar1);
  *sse = auVar1._0_4_;
  return auVar1._0_4_ - (int)((ulong)((long)auVar4._0_4_ * (long)auVar4._0_4_) >> 4);
}

Assistant:

static inline void obmc_variance_w4(const uint8_t *pre, const int pre_stride,
                                    const int32_t *wsrc, const int32_t *mask,
                                    unsigned int *const sse, int *const sum,
                                    const int h) {
  const int pre_step = pre_stride - 4;
  int n = 0;
  __m128i v_sum_d = _mm_setzero_si128();
  __m128i v_sse_d = _mm_setzero_si128();

  assert(IS_POWER_OF_TWO(h));

  do {
    const __m128i v_p_b = xx_loadl_32(pre + n);
    const __m128i v_m_d = _mm_load_si128((const __m128i *)(mask + n));
    const __m128i v_w_d = _mm_load_si128((const __m128i *)(wsrc + n));

    const __m128i v_p_d = _mm_cvtepu8_epi32(v_p_b);

    // Values in both pre and mask fit in 15 bits, and are packed at 32 bit
    // boundaries. We use pmaddwd, as it has lower latency on Haswell
    // than pmulld but produces the same result with these inputs.
    const __m128i v_pm_d = _mm_madd_epi16(v_p_d, v_m_d);

    const __m128i v_diff_d = _mm_sub_epi32(v_w_d, v_pm_d);
    const __m128i v_rdiff_d = xx_roundn_epi32(v_diff_d, 12);
    const __m128i v_sqrdiff_d = _mm_mullo_epi32(v_rdiff_d, v_rdiff_d);

    v_sum_d = _mm_add_epi32(v_sum_d, v_rdiff_d);
    v_sse_d = _mm_add_epi32(v_sse_d, v_sqrdiff_d);

    n += 4;

    if (n % 4 == 0) pre += pre_step;
  } while (n < 4 * h);

  *sum = xx_hsum_epi32_si32(v_sum_d);
  *sse = xx_hsum_epi32_si32(v_sse_d);
}